

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model.c
# Opt level: O3

int32 ngram_score(ngram_model_t *model,char *word,...)

{
  char in_AL;
  uint uVar1;
  int32 iVar2;
  int32 *history_00;
  void **ppvVar3;
  undefined8 in_RCX;
  ulong uVar4;
  void **ppvVar5;
  undefined8 in_RDX;
  size_t n_elem;
  undefined8 in_R8;
  undefined8 in_R9;
  long lVar6;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list history;
  int32 n_used;
  void **local_f0;
  int32 local_dc;
  void *local_d8 [4];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  local_d8[2] = (void *)in_RDX;
  local_d8[3] = (void *)in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  ppvVar3 = &history[0].overflow_arg_area;
  uVar1 = 0x10;
  n_elem = 0xffffffffffffffff;
  do {
    if (uVar1 < 0x29) {
      uVar4 = (ulong)uVar1;
      uVar1 = uVar1 + 8;
      ppvVar5 = (void **)((long)local_d8 + uVar4);
    }
    else {
      ppvVar5 = ppvVar3;
      ppvVar3 = ppvVar3 + 1;
    }
    n_elem = n_elem + 1;
  } while (*ppvVar5 != (void *)0x0);
  history_00 = (int32 *)__ckd_calloc__(n_elem,4,
                                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
                                       ,0x1a6);
  uVar1 = 0x10;
  local_f0 = &history[0].overflow_arg_area;
  lVar6 = 0;
  while( true ) {
    uVar4 = (ulong)uVar1;
    if (uVar4 < 0x29) {
      uVar1 = uVar1 + 8;
      ppvVar3 = (void **)((long)local_d8 + uVar4);
    }
    else {
      ppvVar3 = local_f0;
      local_f0 = local_f0 + 1;
    }
    if ((char *)*ppvVar3 == (char *)0x0) break;
    iVar2 = ngram_wid(model,(char *)*ppvVar3);
    history_00[lVar6] = iVar2;
    lVar6 = lVar6 + 1;
  }
  iVar2 = ngram_wid(model,word);
  iVar2 = ngram_ng_score(model,iVar2,history_00,(int32)lVar6,&local_dc);
  ckd_free(history_00);
  return iVar2;
}

Assistant:

int32
ngram_score(ngram_model_t * model, const char *word, ...)
{
    va_list history;
    const char *hword;
    int32 *histid;
    int32 n_hist;
    int32 n_used;
    int32 prob;

    va_start(history, word);
    n_hist = 0;
    while ((hword = va_arg(history, const char *)) != NULL)
        ++n_hist;
    va_end(history);

    histid = ckd_calloc(n_hist, sizeof(*histid));
    va_start(history, word);
    n_hist = 0;
    while ((hword = va_arg(history, const char *)) != NULL) {
        histid[n_hist] = ngram_wid(model, hword);
        ++n_hist;
    }
    va_end(history);

    prob = ngram_ng_score(model, ngram_wid(model, word),
                          histid, n_hist, &n_used);
    ckd_free(histid);
    return prob;
}